

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasePort.cpp
# Opt level: O1

bool __thiscall BasePort::CheckFwBusGeneration(BasePort *this,string *caller,bool doScan)

{
  int iVar1;
  ostream *poVar2;
  bool bVar3;
  
  bVar3 = this->FwBusGeneration == this->newFwBusGeneration;
  if (!bVar3) {
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (this->outStr,(caller->_M_dataplus)._M_p,caller->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2,": Firewire bus reset, old generation = ",0x27);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,", new generation = ",0x13);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    if (doScan) {
      iVar1 = (*this->_vptr_BasePort[0x1c])(this,caller);
      return SUB41(iVar1,0);
    }
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool BasePort::CheckFwBusGeneration(const std::string &caller, bool doScan)
{
    bool ret = (FwBusGeneration == newFwBusGeneration);
    if (!ret) {
        outStr << caller << ": Firewire bus reset, old generation = " << FwBusGeneration
               << ", new generation = " << newFwBusGeneration << std::endl;
        if (doScan)
            ret = ReScanNodes(caller);
    }
    return ret;
}